

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

bool QUtil::get_env(string *var,string *value)

{
  char *pcVar1;
  char *p;
  string *value_local;
  string *var_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = getenv(pcVar1);
  if (pcVar1 == (char *)0x0) {
    var_local._7_1_ = false;
  }
  else {
    if (value != (string *)0x0) {
      std::__cxx11::string::operator=((string *)value,pcVar1);
    }
    var_local._7_1_ = true;
  }
  return var_local._7_1_;
}

Assistant:

bool
QUtil::get_env(std::string const& var, std::string* value)
{
    // This was basically ripped out of wxWindows.
#ifdef _WIN32
# ifdef NO_GET_ENVIRONMENT
    return false;
# else
    // first get the size of the buffer
    DWORD len = ::GetEnvironmentVariable(var.c_str(), NULL, 0);
    if (len == 0) {
        // this means that there is no such variable
        return false;
    }

    if (value) {
        auto t = QUtil::make_shared_array<char>(len + 1);
        ::GetEnvironmentVariable(var.c_str(), t.get(), len);
        *value = t.get();
    }

    return true;
# endif
#else
    char* p = getenv(var.c_str());
    if (p == nullptr) {
        return false;
    }
    if (value) {
        *value = p;
    }

    return true;
#endif
}